

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collision.cpp
# Opt level: O0

bool __thiscall CCollision::TestBox(CCollision *this,vec2 Pos,vec2 Size,int Flag)

{
  bool bVar1;
  undefined4 in_ESI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  int in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffd0;
  bool local_11;
  vector2_base<float> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  vector2_base<float>::operator*=(&local_10,0.5);
  bVar1 = CheckPoint((CCollision *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0),
                     (float)((ulong)in_RDI >> 0x20),(float)in_RDI,in_stack_ffffffffffffffc4);
  if (bVar1) {
    local_11 = true;
  }
  else {
    bVar1 = CheckPoint((CCollision *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0),
                       (float)((ulong)in_RDI >> 0x20),(float)in_RDI,in_stack_ffffffffffffffc4);
    if (bVar1) {
      local_11 = true;
    }
    else {
      bVar1 = CheckPoint((CCollision *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0),
                         (float)((ulong)in_RDI >> 0x20),(float)in_RDI,in_stack_ffffffffffffffc4);
      if (bVar1) {
        local_11 = true;
      }
      else {
        bVar1 = CheckPoint((CCollision *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0),
                           (float)((ulong)in_RDI >> 0x20),(float)in_RDI,in_stack_ffffffffffffffc4);
        if (bVar1) {
          local_11 = true;
        }
        else {
          local_11 = false;
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_11;
  }
  __stack_chk_fail();
}

Assistant:

bool CCollision::TestBox(vec2 Pos, vec2 Size, int Flag) const
{
	Size *= 0.5f;
	if(CheckPoint(Pos.x-Size.x, Pos.y-Size.y, Flag))
		return true;
	if(CheckPoint(Pos.x+Size.x, Pos.y-Size.y, Flag))
		return true;
	if(CheckPoint(Pos.x-Size.x, Pos.y+Size.y, Flag))
		return true;
	if(CheckPoint(Pos.x+Size.x, Pos.y+Size.y, Flag))
		return true;
	return false;
}